

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseChemObjName(SelectionCompiler *this)

{
  bool bVar1;
  type_info *this_00;
  SelectionCompiler *this_01;
  string name;
  Token token;
  undefined1 local_80 [32];
  any local_60;
  undefined1 local_50 [40];
  any local_28;
  
  tokenNext((Token *)(local_50 + 0x20),this);
  if (local_50._32_4_ == 1) {
    this_00 = std::any::type(&local_28);
    bVar1 = std::type_info::operator==(this_00,(type_info *)&std::__cxx11::string::typeinfo);
    if (bVar1) {
      this_01 = (SelectionCompiler *)local_50;
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 &local_28);
      bVar1 = isNameValid(this_01,(string *)local_50);
      if (bVar1) {
        std::any::
        any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        Token::Token((Token *)local_80,0x40b,&local_60);
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                  (&this->ltokenPostfix,(value_type *)local_80);
        std::any::reset((any *)(local_80 + 8));
        std::any::reset(&local_60);
        bVar1 = true;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,"invalid name: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        bVar1 = compileError(this,(string *)local_80);
        std::__cxx11::string::~string((string *)local_80);
      }
      std::__cxx11::string::~string((string *)local_50);
      goto LAB_00258f0c;
    }
  }
  bVar1 = false;
LAB_00258f0c:
  std::any::reset(&local_28);
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseChemObjName() {
    Token token = tokenNext();
    if (token.tok == Token::identifier &&
        token.value.type() == typeid(std::string)) {
      std::string name = std::any_cast<std::string>(token.value);
      if (isNameValid(name)) {
        return addTokenToPostfix(Token(Token::name, name));
      } else {
        return compileError("invalid name: " + name);
      }
    }

    return false;
  }